

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

void sat_solver_random_polarity(sat_solver *s)

{
  bool bVar1;
  int iVar2;
  word local_20;
  word Polar;
  int k;
  int i;
  sat_solver *s_local;
  
  _k = s;
  for (Polar._4_4_ = 0; Polar._4_4_ < _k->size; Polar._4_4_ = Polar._4_4_ + 0x40) {
    local_20 = Gia_ManRandomW(0);
    Polar._0_4_ = 0;
    while( true ) {
      bVar1 = false;
      if ((int)Polar < 0x40) {
        bVar1 = Polar._4_4_ * 0x40 + (int)Polar < _k->size;
      }
      if (!bVar1) break;
      iVar2 = Abc_TtGetBit(&local_20,(int)Polar);
      _k->polarity[Polar._4_4_ * 0x40 + (int)Polar] = (char)iVar2;
      Polar._0_4_ = (int)Polar + 1;
    }
  }
  return;
}

Assistant:

static void sat_solver_random_polarity(sat_solver* s)
{
    int i, k;
    for ( i = 0; i < s->size; i += 64 )
    {
        word Polar = Gia_ManRandomW(0);
        for ( k = 0; k < 64 && (i << 6) + k < s->size; k++ )
            s->polarity[(i << 6) + k] = Abc_TtGetBit(&Polar, k);
    }
}